

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::buffer_is_packing_standard
          (CompilerGLSL *this,SPIRType *type,BufferPackingStandard packing,
          uint32_t *failed_validation_index,uint32_t start_offset,uint32_t end_offset)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  BufferPackingStandard packing_00;
  size_t sVar5;
  TypedID *this_00;
  SPIRType *type_00;
  Meta *pMVar6;
  Decoration *pDVar7;
  uint *puVar8;
  byte local_fd;
  bool local_e5;
  BufferPackingStandard substruct_packing;
  uint32_t alignment;
  uint local_d4;
  uint local_d0;
  uint32_t end_word;
  uint32_t begin_word;
  uint32_t target_offset;
  uint32_t actual_offset;
  uint32_t packed_size;
  bool member_can_be_unsized;
  uint32_t local_ac;
  undefined1 local_a8 [4];
  uint32_t packed_alignment;
  Bitset member_flags;
  Meta *type_meta;
  SPIRType *memb_type;
  uint32_t i;
  uint local_40;
  uint uStack_3c;
  bool is_top_level_block;
  uint32_t pad_alignment;
  uint32_t offset;
  uint32_t end_offset_local;
  uint32_t start_offset_local;
  uint32_t *failed_validation_index_local;
  SPIRType *pSStack_20;
  BufferPackingStandard packing_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uStack_3c = 0;
  local_40 = 1;
  pad_alignment = end_offset;
  offset = start_offset;
  _end_offset_local = failed_validation_index;
  failed_validation_index_local._4_4_ = packing;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)(type->super_IVariant).self.id,Block);
  local_e5 = true;
  if (!bVar2) {
    local_e5 = Compiler::has_decoration
                         (&this->super_Compiler,(ID)(pSStack_20->super_IVariant).self.id,BufferBlock
                         );
  }
  memb_type._0_4_ = 0;
  do {
    sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(pSStack_20->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    if (sVar5 <= (uint)memb_type) {
LAB_00458f1a:
      this_local._7_1_ = 1;
LAB_00458f1e:
      return (bool)(this_local._7_1_ & 1);
    }
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(pSStack_20->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)(uint)memb_type);
    uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    member_flags.higher._M_h._M_single_bucket._4_4_ = (pSStack_20->super_IVariant).self.id;
    pMVar6 = ParsedIR::find_meta(&(this->super_Compiler).ir,
                                 member_flags.higher._M_h._M_single_bucket._4_4_);
    if (pMVar6 == (Meta *)0x0) {
      memset(local_a8,0,0x40);
      Bitset::Bitset((Bitset *)local_a8);
    }
    else {
      pDVar7 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                         (&(pMVar6->members).super_VectorView<spirv_cross::Meta::Decoration>,
                          (ulong)(uint)memb_type);
      Bitset::Bitset((Bitset *)local_a8,&pDVar7->decoration_flags);
    }
    local_ac = type_to_packed_alignment
                         (this,type_00,(Bitset *)local_a8,failed_validation_index_local._4_4_);
    local_fd = 0;
    if (local_e5 != false) {
      sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(pSStack_20->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      local_fd = 0;
      if ((uint)memb_type + 1 == sVar5) {
        bVar2 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
        local_fd = bVar2 ^ 0xff;
      }
    }
    actual_offset._3_1_ = local_fd & 1;
    target_offset = 0;
    if ((actual_offset._3_1_ == 0) ||
       (bVar2 = packing_is_hlsl(failed_validation_index_local._4_4_), bVar2)) {
      target_offset =
           type_to_packed_size(this,type_00,(Bitset *)local_a8,failed_validation_index_local._4_4_);
    }
    begin_word = Compiler::type_struct_member_offset
                           (&this->super_Compiler,pSStack_20,(uint)memb_type);
    bVar2 = packing_is_hlsl(failed_validation_index_local._4_4_);
    if (bVar2) {
      bVar2 = packing_has_flexible_offset(failed_validation_index_local._4_4_);
      if (bVar2) {
        end_word = begin_word;
      }
      else {
        end_word = uStack_3c;
      }
      local_d0 = end_word >> 4;
      local_d4 = (end_word + target_offset) - 1 >> 4;
      if (local_d0 != local_d4) {
        alignment = 0x10;
        puVar8 = ::std::max<unsigned_int>(&local_ac,&alignment);
        local_ac = *puVar8;
      }
    }
    if (pad_alignment <= begin_word) {
      substruct_packing = BufferPackingStd140EnhancedLayout;
      goto LAB_00458edd;
    }
    puVar8 = ::std::max<unsigned_int>(&local_ac,&local_40);
    uVar1 = *puVar8;
    uStack_3c = (uStack_3c + uVar1) - 1 & (uVar1 - 1 ^ 0xffffffff);
    if ((type_00->basetype == Struct) && ((type_00->pointer & 1U) == 0)) {
      local_40 = local_ac;
    }
    else {
      local_40 = 1;
    }
    if (begin_word < offset) {
LAB_00458ec4:
      uStack_3c = begin_word + target_offset;
      substruct_packing = BufferPackingStd140;
    }
    else {
      bVar2 = packing_has_flexible_offset(failed_validation_index_local._4_4_);
      if (bVar2) {
        if ((begin_word & uVar1 - 1) == 0) goto LAB_00458d9e;
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
      else if (begin_word == uStack_3c) {
LAB_00458d9e:
        bVar2 = Compiler::is_array(&this->super_Compiler,type_00);
        if (bVar2) {
          uVar3 = type_to_packed_array_stride
                            (this,type_00,(Bitset *)local_a8,failed_validation_index_local._4_4_);
          uVar4 = Compiler::type_struct_member_array_stride
                            (&this->super_Compiler,pSStack_20,(uint)memb_type);
          if (uVar3 != uVar4) {
            if (_end_offset_local != (uint32_t *)0x0) {
              *_end_offset_local = (uint)memb_type;
            }
            this_local._7_1_ = 0;
            substruct_packing = BufferPackingStd430;
            goto LAB_00458edd;
          }
        }
        packing_00 = packing_to_substruct_packing(failed_validation_index_local._4_4_);
        if ((((type_00->pointer & 1U) != 0) ||
            (bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                               (&(type_00->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            bVar2)) ||
           (bVar2 = buffer_is_packing_standard(this,type_00,packing_00,(uint32_t *)0x0,0,0xffffffff)
           , bVar2)) goto LAB_00458ec4;
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
      else {
        if (_end_offset_local != (uint32_t *)0x0) {
          *_end_offset_local = (uint)memb_type;
        }
        this_local._7_1_ = 0;
        substruct_packing = BufferPackingStd430;
      }
    }
LAB_00458edd:
    Bitset::~Bitset((Bitset *)local_a8);
    if (substruct_packing != BufferPackingStd140) {
      if (substruct_packing == BufferPackingStd430) goto LAB_00458f1e;
      goto LAB_00458f1a;
    }
    memb_type._0_4_ = (uint)memb_type + 1;
  } while( true );
}

Assistant:

bool CompilerGLSL::buffer_is_packing_standard(const SPIRType &type, BufferPackingStandard packing,
                                              uint32_t *failed_validation_index, uint32_t start_offset,
                                              uint32_t end_offset)
{
	// This is very tricky and error prone, but try to be exhaustive and correct here.
	// SPIR-V doesn't directly say if we're using std430 or std140.
	// SPIR-V communicates this using Offset and ArrayStride decorations (which is what really matters),
	// so we have to try to infer whether or not the original GLSL source was std140 or std430 based on this information.
	// We do not have to consider shared or packed since these layouts are not allowed in Vulkan SPIR-V (they are useless anyways, and custom offsets would do the same thing).
	//
	// It is almost certain that we're using std430, but it gets tricky with arrays in particular.
	// We will assume std430, but infer std140 if we can prove the struct is not compliant with std430.
	//
	// The only two differences between std140 and std430 are related to padding alignment/array stride
	// in arrays and structs. In std140 they take minimum vec4 alignment.
	// std430 only removes the vec4 requirement.

	uint32_t offset = 0;
	uint32_t pad_alignment = 1;

	bool is_top_level_block =
	    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

	for (uint32_t i = 0; i < type.member_types.size(); i++)
	{
		auto &memb_type = get<SPIRType>(type.member_types[i]);

		auto *type_meta = ir.find_meta(type.self);
		auto member_flags = type_meta ? type_meta->members[i].decoration_flags : Bitset{};

		// Verify alignment rules.
		uint32_t packed_alignment = type_to_packed_alignment(memb_type, member_flags, packing);

		// This is a rather dirty workaround to deal with some cases of OpSpecConstantOp used as array size, e.g:
		// layout(constant_id = 0) const int s = 10;
		// const int S = s + 5; // SpecConstantOp
		// buffer Foo { int data[S]; }; // <-- Very hard for us to deduce a fixed value here,
		// we would need full implementation of compile-time constant folding. :(
		// If we are the last member of a struct, there might be cases where the actual size of that member is irrelevant
		// for our analysis (e.g. unsized arrays).
		// This lets us simply ignore that there are spec constant op sized arrays in our buffers.
		// Querying size of this member will fail, so just don't call it unless we have to.
		//
		// This is likely "best effort" we can support without going into unacceptably complicated workarounds.
		bool member_can_be_unsized =
		    is_top_level_block && size_t(i + 1) == type.member_types.size() && !memb_type.array.empty();

		uint32_t packed_size = 0;
		if (!member_can_be_unsized || packing_is_hlsl(packing))
			packed_size = type_to_packed_size(memb_type, member_flags, packing);

		// We only need to care about this if we have non-array types which can straddle the vec4 boundary.
		uint32_t actual_offset = type_struct_member_offset(type, i);

		if (packing_is_hlsl(packing))
		{
			// If a member straddles across a vec4 boundary, alignment is actually vec4.
			uint32_t target_offset;

			// If we intend to use explicit packing, we must check for improper straddle with that offset.
			// In implicit packing, we must check with implicit offset, since the explicit offset
			// might have already accounted for the straddle, and we'd miss the alignment promotion to vec4.
			// This is important when packing sub-structs that don't support packoffset().
			if (packing_has_flexible_offset(packing))
				target_offset = actual_offset;
			else
				target_offset = offset;

			uint32_t begin_word = target_offset / 16;
			uint32_t end_word = (target_offset + packed_size - 1) / 16;

			if (begin_word != end_word)
				packed_alignment = max<uint32_t>(packed_alignment, 16u);
		}

		// Field is not in the specified range anymore and we can ignore any further fields.
		if (actual_offset >= end_offset)
			break;

		uint32_t alignment = max(packed_alignment, pad_alignment);
		offset = (offset + alignment - 1) & ~(alignment - 1);

		// The next member following a struct member is aligned to the base alignment of the struct that came before.
		// GL 4.5 spec, 7.6.2.2.
		if (memb_type.basetype == SPIRType::Struct && !memb_type.pointer)
			pad_alignment = packed_alignment;
		else
			pad_alignment = 1;

		// Only care about packing if we are in the given range
		if (actual_offset >= start_offset)
		{
			// We only care about offsets in std140, std430, etc ...
			// For EnhancedLayout variants, we have the flexibility to choose our own offsets.
			if (!packing_has_flexible_offset(packing))
			{
				if (actual_offset != offset) // This cannot be the packing we're looking for.
				{
					if (failed_validation_index)
						*failed_validation_index = i;
					return false;
				}
			}
			else if ((actual_offset & (alignment - 1)) != 0)
			{
				// We still need to verify that alignment rules are observed, even if we have explicit offset.
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify array stride rules.
			if (is_array(memb_type) &&
			    type_to_packed_array_stride(memb_type, member_flags, packing) !=
			    type_struct_member_array_stride(type, i))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}

			// Verify that sub-structs also follow packing rules.
			// We cannot use enhanced layouts on substructs, so they better be up to spec.
			auto substruct_packing = packing_to_substruct_packing(packing);

			if (!memb_type.pointer && !memb_type.member_types.empty() &&
			    !buffer_is_packing_standard(memb_type, substruct_packing))
			{
				if (failed_validation_index)
					*failed_validation_index = i;
				return false;
			}
		}

		// Bump size.
		offset = actual_offset + packed_size;
	}

	return true;
}